

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O1

void test_read_append_filter_wrong_program(void)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  archive *_a;
  fpos_t pos;
  archive_entry *ae;
  fpos_t local_48;
  archive_entry *local_38;
  
  wVar1 = canRunCommand("bunzip2 -h");
  if (wVar1 != L'\0') {
    fflush(_stderr);
    fgetpos(_stderr,&local_48);
    iVar2 = fileno(_stderr);
    iVar2 = dup(iVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'Þ',(uint)(iVar2 != -1),"(fd = dup(fileno(stderr))) != -1",(void *)0x0);
    pFVar4 = freopen("stderr1","w",_stderr);
    _a = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'â',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar3 = archive_read_set_format(_a,0x30000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'ã',(uint)(iVar3 == 0),"0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR)"
                     ,_a);
    iVar3 = archive_read_append_filter_program(_a,"bunzip2 -q");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'å',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_read_append_filter_program(a, \"bunzip2 -q\")",_a);
    iVar3 = archive_read_open_memory(_a,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'ç',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_read_open_memory(a, archive, sizeof(archive))",_a);
    iVar3 = archive_read_next_header(_a,&local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'è',(uint)(iVar3 < -0x14),
                     "archive_read_next_header(a, &ae) < (ARCHIVE_WARN)",_a);
    iVar3 = archive_read_close(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'é',-0x14,"ARCHIVE_WARN",(long)iVar3,"archive_read_close(a)",_a);
    iVar3 = archive_read_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'ê',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
    if (pFVar4 != (FILE *)0x0) {
      fflush(_stderr);
      iVar3 = fileno(_stderr);
      dup2(iVar2,iVar3);
      clearerr(_stderr);
      fsetpos(_stderr,&local_48);
    }
    close(iVar2);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                 ,L'Ö');
  test_skipping("Can\'t run bunzip2 program on this platform");
  return;
}

Assistant:

DEFINE_TEST(test_read_append_filter_wrong_program)
{
  struct archive_entry *ae;
  struct archive *a;
#if !defined(_WIN32) || defined(__CYGWIN__)
  FILE * fp;
  int fd;
  fpos_t pos;
#endif

  /*
   * If we have "bunzip2 -q", try using that.
   */
  if (!canRunCommand("bunzip2 -h")) {
    skipping("Can't run bunzip2 program on this platform");
    return;
  }

#if !defined(_WIN32) || defined(__CYGWIN__)
  /* bunzip2 will write to stderr, redirect it to a file */
  fflush(stderr);
  fgetpos(stderr, &pos);
  assert((fd = dup(fileno(stderr))) != -1);
  fp = freopen("stderr1", "w", stderr);
#endif

  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_append_filter_program(a, "bunzip2 -q"));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  assertEqualIntA(a, ARCHIVE_WARN, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));

#if !defined(_WIN32) || defined(__CYGWIN__)
  /* restore stderr */
  if (fp != NULL) {
    fflush(stderr);
    dup2(fd, fileno(stderr));
    clearerr(stderr);
    (void)fsetpos(stderr, &pos);
  }
  close(fd);
#endif
}